

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concat.cpp
# Opt level: O2

int __thiscall
ncnn::Concat::forward
          (Concat *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint _c;
  size_t _elemsize;
  Mat *pMVar4;
  long lVar5;
  pointer pMVar6;
  int *piVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  size_t b_3;
  int iVar12;
  long lVar13;
  ulong uVar14;
  int i;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  size_t sVar18;
  size_t b;
  ulong uVar19;
  ulong uVar20;
  void *pvVar21;
  ulong uVar22;
  bool bVar23;
  
  pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar1 = pMVar6->dims;
  _elemsize = pMVar6->elemsize;
  iVar8 = this->axis;
  if (uVar1 == 1) {
    lVar5 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar6) / 0x48;
    piVar7 = &pMVar6->w;
    iVar12 = 0;
    while (bVar23 = lVar5 != 0, lVar5 = lVar5 + -1, bVar23) {
      iVar12 = iVar12 + *piVar7;
      piVar7 = piVar7 + 0x12;
    }
    pMVar4 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar4,iVar12,_elemsize,opt->blob_allocator);
    pvVar21 = pMVar4->data;
    if (pvVar21 == (void *)0x0) {
      return -100;
    }
    if ((long)pMVar4->c * pMVar4->cstep == 0) {
      return -100;
    }
    lVar5 = 0;
    for (uVar19 = 0;
        pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start,
        uVar19 < (ulong)(((long)(bottom_blobs->
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                                super__Vector_impl_data._M_finish - (long)pMVar6) / 0x48);
        uVar19 = uVar19 + 1) {
      sVar18 = (long)*(int *)((long)&pMVar6->w + lVar5) * _elemsize;
      memcpy(pvVar21,*(void **)((long)&pMVar6->data + lVar5),sVar18);
      pvVar21 = (void *)((long)pvVar21 + sVar18);
      lVar5 = lVar5 + 0x48;
    }
  }
  iVar8 = (iVar8 >> 0x1f & uVar1) + iVar8;
  if ((uVar1 == 2) && (iVar8 == 0)) {
    iVar12 = pMVar6->w;
    lVar5 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar6) / 0x48;
    piVar7 = &pMVar6->h;
    iVar9 = 0;
    while (bVar23 = lVar5 != 0, lVar5 = lVar5 + -1, bVar23) {
      iVar9 = iVar9 + *piVar7;
      piVar7 = piVar7 + 0x12;
    }
    pMVar4 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar4,iVar12,iVar9,_elemsize,opt->blob_allocator);
    pvVar21 = pMVar4->data;
    if (pvVar21 == (void *)0x0) {
      return -100;
    }
    if ((long)pMVar4->c * pMVar4->cstep == 0) {
      return -100;
    }
    lVar5 = 0;
    for (uVar19 = 0;
        pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start,
        uVar19 < (ulong)(((long)(bottom_blobs->
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                                super__Vector_impl_data._M_finish - (long)pMVar6) / 0x48);
        uVar19 = uVar19 + 1) {
      sVar18 = (long)*(int *)((long)&pMVar6->h + lVar5) * (long)iVar12 * _elemsize;
      memcpy(pvVar21,*(void **)((long)&pMVar6->data + lVar5),sVar18);
      pvVar21 = (void *)((long)pvVar21 + sVar18);
      lVar5 = lVar5 + 0x48;
    }
  }
  if ((uVar1 == 2) && (iVar8 == 1)) {
    uVar2 = pMVar6->h;
    lVar5 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar6) / 0x48;
    piVar7 = &pMVar6->w;
    iVar12 = 0;
    while (bVar23 = lVar5 != 0, lVar5 = lVar5 + -1, bVar23) {
      iVar12 = iVar12 + *piVar7;
      piVar7 = piVar7 + 0x12;
    }
    pMVar4 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar4,iVar12,uVar2,_elemsize,opt->blob_allocator);
    if (pMVar4->data == (void *)0x0) {
      return -100;
    }
    if ((long)pMVar4->c * pMVar4->cstep == 0) {
      return -100;
    }
    uVar15 = 0;
    uVar19 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar19 = uVar15;
    }
    for (; uVar15 != uVar19; uVar15 = uVar15 + 1) {
      pvVar21 = (void *)((long)pMVar4->w * uVar15 * pMVar4->elemsize + (long)pMVar4->data);
      lVar5 = 0x2c;
      for (uVar20 = 0;
          pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_start,
          uVar20 < (ulong)(((long)(bottom_blobs->
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                                  .super__Vector_impl_data._M_finish - (long)pMVar6) / 0x48);
          uVar20 = uVar20 + 1) {
        lVar10 = (long)*(int *)((long)&pMVar6->data + lVar5);
        memcpy(pvVar21,(void *)(uVar15 * lVar10 * *(long *)((long)pMVar6 + lVar5 + -0x1c) +
                               *(long *)((long)pMVar6 + lVar5 + -0x2c)),lVar10 * _elemsize);
        pvVar21 = (void *)((long)pvVar21 + (long)*(int *)((long)&pMVar6->data + lVar5) * _elemsize);
        lVar5 = lVar5 + 0x48;
      }
    }
  }
  if ((uVar1 - 3 < 2) && (iVar8 == 0)) {
    pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar6) / 0x48;
    piVar7 = &pMVar6->c;
    iVar12 = 0;
    while (bVar23 = lVar5 != 0, lVar5 = lVar5 + -1, bVar23) {
      iVar12 = iVar12 + *piVar7;
      piVar7 = piVar7 + 0x12;
    }
    pMVar4 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar4,pMVar6->w,pMVar6->h,pMVar6->d,iVar12,_elemsize,opt->blob_allocator);
    if (pMVar4->data == (void *)0x0) {
      return -100;
    }
    if ((long)pMVar4->c * pMVar4->cstep == 0) {
      return -100;
    }
    pMVar4->dims = uVar1;
    lVar5 = 0x40;
    iVar12 = 0;
    for (uVar19 = 0;
        pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start,
        uVar19 < (ulong)(((long)(bottom_blobs->
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                                super__Vector_impl_data._M_finish - (long)pMVar6) / 0x48);
        uVar19 = uVar19 + 1) {
      iVar9 = *(int *)((long)pMVar6 + lVar5 + -8);
      memcpy((void *)(pMVar4->cstep * (long)iVar12 * pMVar4->elemsize + (long)pMVar4->data),
             *(void **)((long)pMVar6 + lVar5 + -0x40),
             (long)iVar9 * _elemsize * *(long *)((long)&pMVar6->data + lVar5));
      iVar12 = iVar12 + iVar9;
      lVar5 = lVar5 + 0x48;
    }
  }
  if ((iVar8 == 1 && uVar1 == 3) || (uVar1 == 4 && iVar8 == 2)) {
    pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar2 = pMVar6->d;
    uVar3 = pMVar6->c;
    lVar5 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar6) / 0x48;
    piVar7 = &pMVar6->h;
    iVar12 = 0;
    while (bVar23 = lVar5 != 0, lVar5 = lVar5 + -1, bVar23) {
      iVar12 = iVar12 + *piVar7;
      piVar7 = piVar7 + 0x12;
    }
    pMVar4 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar4,pMVar6->w,iVar12,uVar2,uVar3,_elemsize,opt->blob_allocator);
    if (pMVar4->data == (void *)0x0) {
      return -100;
    }
    if ((long)pMVar4->c * pMVar4->cstep == 0) {
      return -100;
    }
    pMVar4->dims = uVar1;
    uVar15 = 0;
    uVar19 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar19 = uVar15;
    }
    uVar20 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar20 = uVar15;
    }
    for (; uVar15 != uVar20; uVar15 = uVar15 + 1) {
      pvVar21 = (void *)(pMVar4->cstep * uVar15 * pMVar4->elemsize + (long)pMVar4->data);
      for (uVar16 = 0; uVar16 != uVar19; uVar16 = uVar16 + 1) {
        lVar5 = 0x40;
        for (uVar22 = 0;
            pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_start,
            uVar22 < (ulong)(((long)(bottom_blobs->
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pMVar6) / 0x48
                            ); uVar22 = uVar22 + 1) {
          lVar11 = (long)*(int *)((long)pMVar6 + lVar5 + -0x14);
          lVar10 = *(long *)((long)pMVar6 + lVar5 + -0x30);
          lVar13 = (long)*(int *)((long)pMVar6 + lVar5 + -0x10);
          sVar18 = lVar13 * lVar11 * _elemsize;
          memcpy(pvVar21,(void *)(lVar10 * lVar13 * uVar16 * lVar11 +
                                 *(long *)((long)&pMVar6->data + lVar5) * uVar15 * lVar10 +
                                 *(long *)((long)pMVar6 + lVar5 + -0x40)),sVar18);
          pvVar21 = (void *)((long)pvVar21 + sVar18);
          lVar5 = lVar5 + 0x48;
        }
      }
    }
  }
  if ((uVar1 == 3 && iVar8 == 2) || (uVar1 == 4 && iVar8 == 3)) {
    pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar2 = pMVar6->h;
    uVar3 = pMVar6->d;
    _c = pMVar6->c;
    lVar5 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar6) / 0x48;
    piVar7 = &pMVar6->w;
    iVar12 = 0;
    while (bVar23 = lVar5 != 0, lVar5 = lVar5 + -1, bVar23) {
      iVar12 = iVar12 + *piVar7;
      piVar7 = piVar7 + 0x12;
    }
    pMVar4 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar4,iVar12,uVar2,uVar3,_c,_elemsize,opt->blob_allocator);
    if (pMVar4->data == (void *)0x0) {
      return -100;
    }
    if ((long)pMVar4->c * pMVar4->cstep == 0) {
      return -100;
    }
    uVar15 = 0;
    uVar19 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar19 = uVar15;
    }
    pMVar4->dims = uVar1;
    uVar20 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar20 = uVar15;
    }
    uVar16 = (ulong)_c;
    if ((int)_c < 1) {
      uVar16 = uVar15;
    }
    for (; uVar15 != uVar16; uVar15 = uVar15 + 1) {
      pvVar21 = (void *)(pMVar4->cstep * uVar15 * pMVar4->elemsize + (long)pMVar4->data);
      for (uVar22 = 0; uVar22 != uVar20; uVar22 = uVar22 + 1) {
        for (uVar14 = 0; uVar14 != uVar19; uVar14 = uVar14 + 1) {
          lVar5 = 0x40;
          for (uVar17 = 0;
              pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_start,
              uVar17 < (ulong)(((long)(bottom_blobs->
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                      _M_impl.super__Vector_impl_data._M_finish - (long)pMVar6) /
                              0x48); uVar17 = uVar17 + 1) {
            lVar11 = (long)*(int *)((long)pMVar6 + lVar5 + -0x14);
            lVar10 = *(long *)((long)pMVar6 + lVar5 + -0x30);
            lVar13 = lVar10 * lVar11;
            memcpy(pvVar21,(void *)(lVar13 * uVar14 +
                                    (long)*(int *)((long)pMVar6 + lVar5 + -0x10) * uVar22 * lVar13 +
                                   *(long *)((long)&pMVar6->data + lVar5) * uVar15 * lVar10 +
                                   *(long *)((long)pMVar6 + lVar5 + -0x40)),lVar11 * _elemsize);
            pvVar21 = (void *)((long)pvVar21 +
                              (long)*(int *)((long)pMVar6 + lVar5 + -0x14) * _elemsize);
            lVar5 = lVar5 + 0x48;
          }
        }
      }
    }
  }
  if (uVar1 != 4) {
    return 0;
  }
  if (iVar8 == 1) {
    pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar1 = pMVar6->c;
    lVar5 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar6) / 0x48;
    piVar7 = &pMVar6->d;
    iVar8 = 0;
    while (bVar23 = lVar5 != 0, lVar5 = lVar5 + -1, bVar23) {
      iVar8 = iVar8 + *piVar7;
      piVar7 = piVar7 + 0x12;
    }
    pMVar4 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar4,pMVar6->w,pMVar6->h,iVar8,uVar1,_elemsize,opt->blob_allocator);
    if (pMVar4->data == (void *)0x0) {
      return -100;
    }
    if ((long)pMVar4->c * pMVar4->cstep != 0) {
      uVar19 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar19 = 0;
      }
      for (uVar15 = 0; uVar15 != uVar19; uVar15 = uVar15 + 1) {
        pvVar21 = (void *)(pMVar4->cstep * uVar15 * pMVar4->elemsize + (long)pMVar4->data);
        lVar5 = 0x40;
        for (uVar20 = 0;
            pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_start,
            uVar20 < (ulong)(((long)(bottom_blobs->
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pMVar6) / 0x48
                            ); uVar20 = uVar20 + 1) {
          sVar18 = (long)*(int *)((long)pMVar6 + lVar5 + -0xc) * _elemsize *
                   (long)*(int *)((long)pMVar6 + lVar5 + -0x10) *
                   (long)*(int *)((long)pMVar6 + lVar5 + -0x14);
          memcpy(pvVar21,(void *)(*(long *)((long)&pMVar6->data + lVar5) * uVar15 *
                                  *(long *)((long)pMVar6 + lVar5 + -0x30) +
                                 *(long *)((long)pMVar6 + lVar5 + -0x40)),sVar18);
          pvVar21 = (void *)((long)pvVar21 + sVar18);
          lVar5 = lVar5 + 0x48;
        }
      }
      return 0;
    }
    return -100;
  }
  return 0;
}

Assistant:

int Concat::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    int dims = bottom_blobs[0].dims;
    size_t elemsize = bottom_blobs[0].elemsize;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        // concat vector
        // total length
        int top_w = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        unsigned char* outptr = top_blob;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            int w = bottom_blob.w;

            const unsigned char* ptr = bottom_blob;
            memcpy(outptr, ptr, w * elemsize);

            outptr += w * elemsize;
        }
    }

    if (dims == 2 && positive_axis == 0)
    {
        // concat image
        int w = bottom_blobs[0].w;

        // total height
        int top_h = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_h += bottom_blob.h;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, top_h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        unsigned char* outptr = top_blob;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            int size = w * bottom_blob.h;

            const unsigned char* ptr = bottom_blob;
            memcpy(outptr, ptr, size * elemsize);

            outptr += size * elemsize;
        }
    }

    if (dims == 2 && positive_axis == 1)
    {
        // interleave image row
        int h = bottom_blobs[0].h;

        // total width
        int top_w = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            unsigned char* outptr = top_blob.row<unsigned char>(i);
            for (size_t b = 0; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob = bottom_blobs[b];

                const unsigned char* ptr = bottom_blob.row<const unsigned char>(i);
                memcpy(outptr, ptr, bottom_blob.w * elemsize);

                outptr += bottom_blob.w * elemsize;
            }
        }
    }

    if ((dims == 3 || dims == 4) && positive_axis == 0)
    {
        // concat dim
        int w = bottom_blobs[0].w;
        int h = bottom_blobs[0].h;
        int d = bottom_blobs[0].d;

        // total channels
        int top_channels = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_channels += bottom_blob.c;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, h, d, top_channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        top_blob.dims = dims;

        int q = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            int channels = bottom_blob.c;
            size_t size = bottom_blob.cstep * channels;

            const unsigned char* ptr = bottom_blob;
            unsigned char* outptr = top_blob.channel(q);
            memcpy(outptr, ptr, size * elemsize);

            q += channels;
        }
    }

    if ((dims == 3 && positive_axis == 1) || (dims == 4 && positive_axis == 2))
    {
        // interleave dim height
        int w = bottom_blobs[0].w;
        int d = bottom_blobs[0].d;
        int channels = bottom_blobs[0].c;

        // total height
        int top_h = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_h += bottom_blob.h;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, top_h, d, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        top_blob.dims = dims;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            unsigned char* outptr = top_blob.channel(q);

            for (int i = 0; i < d; i++)
            {
                for (size_t b = 0; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob = bottom_blobs[b];

                    int size = bottom_blob.w * bottom_blob.h;

                    const unsigned char* ptr = bottom_blob.channel(q).depth(i);
                    memcpy(outptr, ptr, size * elemsize);

                    outptr += size * elemsize;
                }
            }
        }
    }

    if ((dims == 3 && positive_axis == 2) || (dims == 4 && positive_axis == 3))
    {
        // interleave dim width
        int h = bottom_blobs[0].h;
        int d = bottom_blobs[0].d;
        int channels = bottom_blobs[0].c;

        // total width
        int top_w = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, h, d, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        top_blob.dims = dims;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            unsigned char* outptr = top_blob.channel(q);

            for (int i = 0; i < d; i++)
            {
                for (int j = 0; j < h; j++)
                {
                    for (size_t b = 0; b < bottom_blobs.size(); b++)
                    {
                        const Mat& bottom_blob = bottom_blobs[b];

                        const unsigned char* ptr = bottom_blob.channel(q).depth(i).row<const unsigned char>(j);
                        memcpy(outptr, ptr, bottom_blob.w * elemsize);

                        outptr += bottom_blob.w * elemsize;
                    }
                }
            }
        }
    }

    if (dims == 4 && positive_axis == 1)
    {
        // interleave dim depth
        int w = bottom_blobs[0].w;
        int h = bottom_blobs[0].h;
        int channels = bottom_blobs[0].c;

        // total depth
        int top_d = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_d += bottom_blob.d;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, h, top_d, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            unsigned char* outptr = top_blob.channel(q);

            for (size_t b = 0; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob = bottom_blobs[b];

                int size = bottom_blob.w * bottom_blob.h * bottom_blob.d;

                const unsigned char* ptr = bottom_blob.channel(q);
                memcpy(outptr, ptr, size * elemsize);

                outptr += size * elemsize;
            }
        }
    }

    return 0;
}